

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O1

void __thiscall Assimp::glTFImporter::ImportEmbeddedTextures(glTFImporter *this,Asset *r)

{
  uint uVar1;
  Image *pIVar2;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> _Var3;
  size_t sVar4;
  aiTexture **ppaVar5;
  pointer ppIVar6;
  aiTexture *paVar7;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  value_type_conflict4 local_34;
  
  local_34 = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->embeddedTexIdxs,
             (ulong)((long)(r->images).mObjs.
                           super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(r->images).mObjs.
                          super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3 & 0xffffffff,&local_34);
  ppIVar6 = (r->images).mObjs.super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (ulong)((long)(r->images).mObjs.
                         super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppIVar6) >> 3 & 0xffffffff;
  if (uVar11 == 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    uVar12 = 0;
    do {
      iVar10 = (iVar10 + 1) - (uint)(ppIVar6[uVar12]->mDataLength == 0);
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  if (iVar10 != 0) {
    ppaVar5 = (aiTexture **)operator_new__((long)iVar10 << 3);
    this->mScene->mTextures = ppaVar5;
    ppIVar6 = (r->images).mObjs.super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(r->images).mObjs.
                            super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >> 3) != 0) {
      uVar11 = 0;
      do {
        pIVar2 = ppIVar6[uVar11];
        if (pIVar2->mDataLength != 0) {
          uVar1 = this->mScene->mNumTextures;
          this->mScene->mNumTextures = uVar1 + 1;
          (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = uVar1;
          paVar7 = (aiTexture *)operator_new(0x428);
          paVar7->mWidth = 0;
          paVar7->mHeight = 0;
          paVar7->pcData = (aiTexel *)0x0;
          (paVar7->mFilename).length = 0;
          (paVar7->mFilename).data[0] = '\0';
          memset((paVar7->mFilename).data + 1,0x1b,0x3ff);
          paVar7->achFormatHint[0] = '\0';
          paVar7->achFormatHint[1] = '\0';
          paVar7->achFormatHint[2] = '\0';
          paVar7->achFormatHint[3] = '\0';
          this->mScene->mTextures[(int)uVar1] = paVar7;
          sVar4 = pIVar2->mDataLength;
          _Var3._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (pIVar2->mData)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t;
          (pIVar2->mData)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t =
               (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
          pIVar2->mDataLength = 0;
          paVar7->mWidth = (uint)sVar4;
          paVar7->mHeight = 0;
          paVar7->pcData =
               (aiTexel *)
               _Var3._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          if ((pIVar2->mimeType)._M_string_length != 0) {
            pcVar8 = strchr((pIVar2->mimeType)._M_dataplus._M_p,0x2f);
            pcVar8 = pcVar8 + 1;
            iVar10 = strcmp(pcVar8,"jpeg");
            if (iVar10 == 0) {
              pcVar8 = "jpg";
            }
            sVar9 = strlen(pcVar8);
            if (sVar9 < 4) {
              strcpy(paVar7->achFormatHint,pcVar8);
            }
          }
        }
        uVar11 = uVar11 + 1;
        ppIVar6 = (r->images).mObjs.
                  super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar11 < ((ulong)((long)(r->images).mObjs.
                                       super__Vector_base<glTF::Image_*,_std::allocator<glTF::Image_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6)
                         >> 3 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void glTFImporter::ImportEmbeddedTextures(glTF::Asset& r)
{
    embeddedTexIdxs.resize(r.images.Size(), -1);

    int numEmbeddedTexs = 0;
    for (size_t i = 0; i < r.images.Size(); ++i) {
        if (r.images[i].HasData())
            numEmbeddedTexs += 1;
    }

    if (numEmbeddedTexs == 0)
        return;

    mScene->mTextures = new aiTexture*[numEmbeddedTexs];

    // Add the embedded textures
    for (size_t i = 0; i < r.images.Size(); ++i) {
        Image &img = r.images[i];
        if (!img.HasData()) continue;

        int idx = mScene->mNumTextures++;
        embeddedTexIdxs[i] = idx;

        aiTexture* tex = mScene->mTextures[idx] = new aiTexture();

        size_t length = img.GetDataLength();
        void* data = img.StealData();

        tex->mWidth = static_cast<unsigned int>(length);
        tex->mHeight = 0;
        tex->pcData = reinterpret_cast<aiTexel*>(data);

        if (!img.mimeType.empty()) {
            const char* ext = strchr(img.mimeType.c_str(), '/') + 1;
            if (ext) {
                if (strcmp(ext, "jpeg") == 0) ext = "jpg";

                size_t len = strlen(ext);
                if (len <= 3) {
                    strcpy(tex->achFormatHint, ext);
                }
            }
        }
    }
}